

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::FunctionalTest1_2
          (FunctionalTest1_2 *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"two_subroutines_single_subroutine_uniform",
             "Verifies the subroutines work correctly in a vertex shader for bool/float/int/uint/double/*vec*/*mat* argument and return types"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FunctionalTest1_2_01dca3c8;
  this->m_has_test_passed = true;
  this->m_po_id = 0;
  this->m_po_getter0_subroutine_index = 0xffffffff;
  this->m_po_getter1_subroutine_index = 0xffffffff;
  this->m_po_subroutine_uniform_index = -1;
  (this->m_test_cases).
  super__Vector_base<gl4cts::ShaderSubroutine::FunctionalTest1_2::_test_case,_std::allocator<gl4cts::ShaderSubroutine::FunctionalTest1_2::_test_case>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::ShaderSubroutine::FunctionalTest1_2::_test_case,_std::allocator<gl4cts::ShaderSubroutine::FunctionalTest1_2::_test_case>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::ShaderSubroutine::FunctionalTest1_2::_test_case,_std::allocator<gl4cts::ShaderSubroutine::FunctionalTest1_2::_test_case>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_xfb_bo_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

FunctionalTest1_2::FunctionalTest1_2(deqp::Context& context)
	: TestCase(context, "two_subroutines_single_subroutine_uniform",
			   "Verifies the subroutines work correctly in a vertex shader for"
			   " bool/float/int/uint/double/*vec*/*mat* argument and return types")
	, m_has_test_passed(true)
	, m_po_id(0)
	, m_po_getter0_subroutine_index(GL_INVALID_INDEX)
	, m_po_getter1_subroutine_index(GL_INVALID_INDEX)
	, m_po_subroutine_uniform_index(-1)
	, m_xfb_bo_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}